

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall draco::Mesh::DeleteAttribute(Mesh *this,int att_id)

{
  size_type sVar1;
  iterator __position;
  int in_ESI;
  __normal_iterator<draco::Mesh::AttributeData_*,_std::vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>_>
  *in_RDI;
  vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_> *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
  *in_stack_ffffffffffffffd0;
  
  PointCloud::DeleteAttribute(&this->super_PointCloud,att_id);
  if (-1 < in_ESI) {
    sVar1 = std::vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>::
            size((vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_> *)
                 (in_RDI + 0x15));
    if (in_ESI < (int)sVar1) {
      this_00 = (vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_> *)
                (in_RDI + 0x15);
      __position = std::
                   vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>::
                   begin(this_00);
      __gnu_cxx::
      __normal_iterator<draco::Mesh::AttributeData_*,_std::vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>_>
      ::operator+(in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
      __gnu_cxx::
      __normal_iterator<draco::Mesh::AttributeData_const*,std::vector<draco::Mesh::AttributeData,std::allocator<draco::Mesh::AttributeData>>>
      ::__normal_iterator<draco::Mesh::AttributeData*>
                ((__normal_iterator<const_draco::Mesh::AttributeData_*,_std::vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>_>
                  *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0),
                 (__normal_iterator<draco::Mesh::AttributeData_*,_std::vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>_>
                  *)this_00);
      std::vector<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>::erase
                (in_stack_ffffffffffffffd0,(const_iterator)__position._M_current);
    }
  }
  return;
}

Assistant:

void DeleteAttribute(int att_id) override {
    PointCloud::DeleteAttribute(att_id);
    if (att_id >= 0 && att_id < static_cast<int>(attribute_data_.size())) {
      attribute_data_.erase(attribute_data_.begin() + att_id);
    }
#ifdef DRACO_TRANSCODER_SUPPORTED
    UpdateMeshFeaturesAfterDeletedAttribute(att_id);
#endif
  }